

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_data.cpp
# Opt level: O0

int AF_DObject_BAM(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
                  int numret)

{
  TAngle<double> local_50;
  uint local_44;
  double dStack_40;
  int u;
  double ang;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  TArray<VMValue,_VMValue> *pTStack_20;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  ang._0_4_ = 0;
  ang._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pTStack_20 = defaultparam;
  defaultparam_local = (TArray<VMValue,_VMValue> *)param;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_data.cpp"
                  ,0x345,"int AF_DObject_BAM(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if ((param->field_0).field_3.Type == '\x01') {
    dStack_40 = (param->field_0).f;
    TAngle<double>::TAngle(&local_50,dStack_40);
    local_44 = TAngle<double>::BAMs(&local_50);
    if (ang._4_4_ < 1) {
      param_local._4_4_ = 0;
    }
    else {
      if (_paramnum == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_data.cpp"
                      ,0x346,
                      "int AF_DObject_BAM(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      VMReturn::SetInt(_paramnum,local_44);
      param_local._4_4_ = 1;
    }
    return param_local._4_4_;
  }
  __assert_fail("param[paramnum].Type == REGT_FLOAT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_data.cpp"
                ,0x345,"int AF_DObject_BAM(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(DObject, BAM)
{
	PARAM_PROLOGUE;
	PARAM_FLOAT(ang);
	ACTION_RETURN_INT(DAngle(ang).BAMs());
}